

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

void subr_copytimestats(LispPTR *args)

{
  LispPTR *pLVar1;
  LispPTR *pLVar2;
  long lVar3;
  byte bVar4;
  
  bVar4 = 0;
  pLVar1 = NativeAligned4FromLAddr(*args);
  pLVar2 = NativeAligned4FromLAddr(args[1]);
  update_miscstats();
  for (lVar3 = 0x1f; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pLVar2 = *pLVar1;
    pLVar1 = pLVar1 + (ulong)bVar4 * -2 + 1;
    pLVar2 = pLVar2 + (ulong)bVar4 * -2 + 1;
  }
  return;
}

Assistant:

void subr_copytimestats(LispPTR args[])
{
  MISCSTATS *source;
  MISCSTATS *dest;
  source = (MISCSTATS *)NativeAligned4FromLAddr(args[0]);
  dest = (MISCSTATS *)NativeAligned4FromLAddr(args[1]);
  update_miscstats();
  *dest = *source;
}